

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_image_to_ascii(nifti_image *nim)

{
  uint uVar1;
  mat44 R;
  mat44 R_00;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_e8;
  char *local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  int local_84;
  int local_80;
  int k_1;
  int j_1;
  int i_1;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int k;
  int j;
  int i;
  int nbuf;
  char *ebuf;
  char *buf;
  nifti_image *nim_local;
  
  if (nim == (nifti_image *)0x0) {
    nim_local = (nifti_image *)0x0;
  }
  else {
    buf = (char *)nim;
    ebuf = (char *)calloc(1,0xfffe);
    j = 0;
    if (ebuf == (char *)0x0) {
      fprintf(_stderr,"** NITA: failed to alloc %d bytes\n",0xfffe);
      nim_local = (nifti_image *)0x0;
    }
    else {
      sprintf(ebuf,"<nifti_image\n");
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      if (*(int *)(buf + 0x1e8) == 1) {
        local_e0 = "NIFTI-1+";
      }
      else {
        if (*(int *)(buf + 0x1e8) == 2) {
          local_e8 = "NIFTI-1";
        }
        else {
          local_e8 = "ANALYZE-7.5";
          if (*(int *)(buf + 0x1e8) == 3) {
            local_e8 = "NIFTI-1A";
          }
        }
        local_e0 = local_e8;
      }
      sprintf(pcVar2 + sVar3,"  nifti_type = \'%s\'\n",local_e0);
      _i = escapize_string(*(char **)(buf + 0x278));
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  header_filename = %s\n",_i);
      free(_i);
      _i = escapize_string(*(char **)(buf + 0x280));
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  image_filename = %s\n",_i);
      free(_i);
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  image_offset = \'%d\'\n",(ulong)*(uint *)(buf + 0x288));
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  ndim = \'%d\'\n",(ulong)*(uint *)buf);
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  nx = \'%d\'\n",(ulong)*(uint *)(buf + 4));
      pcVar2 = ebuf;
      if (1 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  ny = \'%d\'\n",(ulong)*(uint *)(buf + 8));
      }
      pcVar2 = ebuf;
      if (2 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  nz = \'%d\'\n",(ulong)*(uint *)(buf + 0xc));
      }
      pcVar2 = ebuf;
      if (3 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  nt = \'%d\'\n",(ulong)*(uint *)(buf + 0x10));
      }
      pcVar2 = ebuf;
      if (4 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  nu = \'%d\'\n",(ulong)*(uint *)(buf + 0x14));
      }
      pcVar2 = ebuf;
      if (5 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  nv = \'%d\'\n",(ulong)*(uint *)(buf + 0x18));
      }
      pcVar2 = ebuf;
      if (6 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  nw = \'%d\'\n",(ulong)*(uint *)(buf + 0x1c));
      }
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  dx = \'%g\'\n",SUB84((double)*(float *)(buf + 0x50),0));
      pcVar2 = ebuf;
      if (1 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  dy = \'%g\'\n",SUB84((double)*(float *)(buf + 0x54),0));
      }
      pcVar2 = ebuf;
      if (2 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  dz = \'%g\'\n",SUB84((double)*(float *)(buf + 0x58),0));
      }
      pcVar2 = ebuf;
      if (3 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  dt = \'%g\'\n",SUB84((double)*(float *)(buf + 0x5c),0));
      }
      pcVar2 = ebuf;
      if (4 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  du = \'%g\'\n",SUB84((double)*(float *)(buf + 0x60),0));
      }
      pcVar2 = ebuf;
      if (5 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  dv = \'%g\'\n",SUB84((double)*(float *)(buf + 100),0));
      }
      pcVar2 = ebuf;
      if (6 < *(int *)buf) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  dw = \'%g\'\n",SUB84((double)*(float *)(buf + 0x68),0));
      }
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  datatype = \'%d\'\n",(ulong)*(uint *)(buf + 0x4c));
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      pcVar4 = nifti_datatype_string(*(int *)(buf + 0x4c));
      sprintf(pcVar2 + sVar3,"  datatype_name = \'%s\'\n",pcVar4);
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  nvox = \'%u\'\n",*(ulong *)(buf + 0x40) & 0xffffffff);
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  nbyper = \'%d\'\n",(ulong)*(uint *)(buf + 0x48));
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      pcVar4 = "LSB_FIRST";
      if (*(int *)(buf + 0x290) == 2) {
        pcVar4 = "MSB_FIRST";
      }
      sprintf(pcVar2 + sVar3,"  byteorder = \'%s\'\n",pcVar4);
      pcVar2 = ebuf;
      if (*(float *)(buf + 0x94) < *(float *)(buf + 0x98)) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  cal_min = \'%g\'\n",SUB84((double)*(float *)(buf + 0x94),0));
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  cal_max = \'%g\'\n",SUB84((double)*(float *)(buf + 0x98),0));
      }
      pcVar2 = ebuf;
      if ((*(float *)(buf + 0x8c) != 0.0) || (NAN(*(float *)(buf + 0x8c)))) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  scl_slope = \'%g\'\n",SUB84((double)*(float *)(buf + 0x8c),0));
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  scl_inter = \'%g\'\n",SUB84((double)*(float *)(buf + 0x90),0));
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0x1ec)) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  intent_code = \'%d\'\n",(ulong)*(uint *)(buf + 0x1ec));
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        pcVar4 = nifti_intent_string(*(int *)(buf + 0x1ec));
        sprintf(pcVar2 + sVar3,"  intent_code_name = \'%s\'\n",pcVar4);
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  intent_p1 = \'%g\'\n",SUB84((double)*(float *)(buf + 0x1f0),0));
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  intent_p2 = \'%g\'\n",SUB84((double)*(float *)(buf + 500),0));
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  intent_p3 = \'%g\'\n",SUB84((double)*(float *)(buf + 0x1f8),0));
        if (buf[0x1fc] != '\0') {
          _i = escapize_string(buf + 0x1fc);
          pcVar2 = ebuf;
          sVar3 = strlen(ebuf);
          sprintf(pcVar2 + sVar3,"  intent_name = %s\n",_i);
          free(_i);
        }
      }
      pcVar2 = ebuf;
      if ((*(float *)(buf + 0x1dc) != 0.0) || (NAN(*(float *)(buf + 0x1dc)))) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  toffset = \'%g\'\n",SUB84((double)*(float *)(buf + 0x1dc),0));
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0x1e0)) {
        sVar3 = strlen(ebuf);
        uVar1 = *(uint *)(buf + 0x1e0);
        pcVar4 = nifti_units_string(*(int *)(buf + 0x1e0));
        sprintf(pcVar2 + sVar3,"  xyz_units = \'%d\'\n  xyz_units_name = \'%s\'\n",(ulong)uVar1,
                pcVar4);
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0x1e4)) {
        sVar3 = strlen(ebuf);
        uVar1 = *(uint *)(buf + 0x1e4);
        pcVar4 = nifti_units_string(*(int *)(buf + 0x1e4));
        sprintf(pcVar2 + sVar3,"  time_units = \'%d\'\n  time_units_name = \'%s\'\n",(ulong)uVar1,
                pcVar4);
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0xa4)) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  freq_dim = \'%d\'\n",(ulong)*(uint *)(buf + 0xa4));
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0xa8)) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  phase_dim = \'%d\'\n",(ulong)*(uint *)(buf + 0xa8));
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0xac)) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  slice_dim = \'%d\'\n",(ulong)*(uint *)(buf + 0xac));
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0xb0)) {
        sVar3 = strlen(ebuf);
        uVar1 = *(uint *)(buf + 0xb0);
        pcVar4 = nifti_slice_string(*(int *)(buf + 0xb0));
        sprintf(pcVar2 + sVar3,"  slice_code = \'%d\'\n  slice_code_name = \'%s\'\n",(ulong)uVar1,
                pcVar4);
      }
      pcVar2 = ebuf;
      if ((-1 < *(int *)(buf + 0xb4)) && (*(int *)(buf + 0xb4) < *(int *)(buf + 0xb8))) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  slice_start = \'%d\'\n  slice_end = \'%d\'\n",
                (ulong)*(uint *)(buf + 0xb4),(ulong)*(uint *)(buf + 0xb8));
      }
      pcVar2 = ebuf;
      if ((*(float *)(buf + 0xbc) != 0.0) || (NAN(*(float *)(buf + 0xbc)))) {
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  slice_duration = \'%g\'\n",SUB84((double)*(float *)(buf + 0xbc),0)
               );
      }
      if (buf[0x20c] != '\0') {
        _i = escapize_string(buf + 0x20c);
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  descrip = %s\n",_i);
        free(_i);
      }
      if (buf[0x25c] != '\0') {
        _i = escapize_string(buf + 0x25c);
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,"  aux_file = %s\n",_i);
        free(_i);
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0x9c)) {
        sVar3 = strlen(ebuf);
        uVar1 = *(uint *)(buf + 0x9c);
        pcVar4 = nifti_xform_string(*(int *)(buf + 0x9c));
        sprintf(pcVar2 + sVar3,
                "  qform_code = \'%d\'\n  qform_code_name = \'%s\'\n  qto_xyz_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n"
                ,SUB84((double)*(float *)(buf + 0xdc),0),SUB84((double)*(float *)(buf + 0xe0),0),
                SUB84((double)*(float *)(buf + 0xe4),0),SUB84((double)*(float *)(buf + 0xe8),0),
                (double)*(float *)(buf + 0xec),(double)*(float *)(buf + 0xf0),
                (double)*(float *)(buf + 0xf4),(double)*(float *)(buf + 0xf8),(ulong)uVar1,pcVar4);
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,
                "  qto_ijk_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n",
                SUB84((double)*(float *)(buf + 0x11c),0),SUB84((double)*(float *)(buf + 0x120),0),
                SUB84((double)*(float *)(buf + 0x124),0),SUB84((double)*(float *)(buf + 0x128),0),
                (double)*(float *)(buf + 300),(double)*(float *)(buf + 0x130),
                (double)*(float *)(buf + 0x134),(double)*(float *)(buf + 0x138));
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,
                "  quatern_b = \'%g\'\n  quatern_c = \'%g\'\n  quatern_d = \'%g\'\n  qoffset_x = \'%g\'\n  qoffset_y = \'%g\'\n  qoffset_z = \'%g\'\n  qfac = \'%g\'\n"
                ,SUB84((double)*(float *)(buf + 0xc0),0),SUB84((double)*(float *)(buf + 0xc4),0),
                SUB84((double)*(float *)(buf + 200),0),SUB84((double)*(float *)(buf + 0xcc),0),
                (double)*(float *)(buf + 0xd0),(double)*(float *)(buf + 0xd4),
                (double)*(float *)(buf + 0xd8));
        memcpy(&j_1,buf + 0xdc,0x40);
        R.m[0][2] = (float)(undefined4)uStack_70;
        R.m[0][3] = (float)uStack_70._4_4_;
        R.m[0][0] = (float)j_1;
        R.m[0][1] = (float)i_1;
        R.m[1][0] = (float)(undefined4)local_68;
        R.m[1][1] = (float)local_68._4_4_;
        R.m[1][2] = (float)(undefined4)uStack_60;
        R.m[1][3] = (float)uStack_60._4_4_;
        R.m[2][0] = (float)(undefined4)local_58;
        R.m[2][1] = (float)local_58._4_4_;
        R.m[2][2] = (float)(undefined4)uStack_50;
        R.m[2][3] = (float)uStack_50._4_4_;
        R.m[3][0] = (float)(undefined4)local_48;
        R.m[3][1] = (float)local_48._4_4_;
        R.m[3][2] = (float)(undefined4)uStack_40;
        R.m[3][3] = (float)uStack_40._4_4_;
        nifti_mat44_to_orientation(R,&k,&local_34,&local_38);
        pcVar2 = ebuf;
        if (((0 < k) && (0 < local_34)) && (0 < local_38)) {
          sVar3 = strlen(ebuf);
          pcVar4 = nifti_orientation_string(k);
          pcVar5 = nifti_orientation_string(local_34);
          pcVar6 = nifti_orientation_string(local_38);
          sprintf(pcVar2 + sVar3,
                  "  qform_i_orientation = \'%s\'\n  qform_j_orientation = \'%s\'\n  qform_k_orientation = \'%s\'\n"
                  ,pcVar4,pcVar5,pcVar6);
        }
      }
      pcVar2 = ebuf;
      if (0 < *(int *)(buf + 0xa0)) {
        sVar3 = strlen(ebuf);
        uVar1 = *(uint *)(buf + 0xa0);
        pcVar4 = nifti_xform_string(*(int *)(buf + 0xa0));
        sprintf(pcVar2 + sVar3,
                "  sform_code = \'%d\'\n  sform_code_name = \'%s\'\n  sto_xyz_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n"
                ,SUB84((double)*(float *)(buf + 0x15c),0),SUB84((double)*(float *)(buf + 0x160),0),
                SUB84((double)*(float *)(buf + 0x164),0),SUB84((double)*(float *)(buf + 0x168),0),
                (double)*(float *)(buf + 0x16c),(double)*(float *)(buf + 0x170),
                (double)*(float *)(buf + 0x174),(double)*(float *)(buf + 0x178),(ulong)uVar1,pcVar4)
        ;
        pcVar2 = ebuf;
        sVar3 = strlen(ebuf);
        sprintf(pcVar2 + sVar3,
                "  sto_ijk matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n",
                SUB84((double)*(float *)(buf + 0x19c),0),SUB84((double)*(float *)(buf + 0x1a0),0),
                SUB84((double)*(float *)(buf + 0x1a4),0),SUB84((double)*(float *)(buf + 0x1a8),0),
                (double)*(float *)(buf + 0x1ac),(double)*(float *)(buf + 0x1b0),
                (double)*(float *)(buf + 0x1b4),(double)*(float *)(buf + 0x1b8));
        memcpy(&local_c8,buf + 0x15c,0x40);
        R_00.m[0][2] = (float)(undefined4)uStack_c0;
        R_00.m[0][3] = (float)uStack_c0._4_4_;
        R_00.m[0][0] = (float)(undefined4)local_c8;
        R_00.m[0][1] = (float)local_c8._4_4_;
        R_00.m[1][0] = (float)(undefined4)local_b8;
        R_00.m[1][1] = (float)local_b8._4_4_;
        R_00.m[1][2] = (float)(undefined4)uStack_b0;
        R_00.m[1][3] = (float)uStack_b0._4_4_;
        R_00.m[2][0] = (float)(undefined4)local_a8;
        R_00.m[2][1] = (float)local_a8._4_4_;
        R_00.m[2][2] = (float)(undefined4)uStack_a0;
        R_00.m[2][3] = (float)uStack_a0._4_4_;
        R_00.m[3][0] = (float)(undefined4)local_98;
        R_00.m[3][1] = (float)local_98._4_4_;
        R_00.m[3][2] = (float)(undefined4)uStack_90;
        R_00.m[3][3] = (float)uStack_90._4_4_;
        nifti_mat44_to_orientation(R_00,&k_1,&local_80,&local_84);
        pcVar2 = ebuf;
        if (((0 < k_1) && (0 < local_80)) && (0 < local_84)) {
          sVar3 = strlen(ebuf);
          pcVar4 = nifti_orientation_string(k_1);
          pcVar5 = nifti_orientation_string(local_80);
          pcVar6 = nifti_orientation_string(local_84);
          sprintf(pcVar2 + sVar3,
                  "  sform_i_orientation = \'%s\'\n  sform_j_orientation = \'%s\'\n  sform_k_orientation = \'%s\'\n"
                  ,pcVar4,pcVar5,pcVar6);
        }
      }
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"  num_ext = \'%d\'\n",(ulong)*(uint *)(buf + 0x2a0));
      pcVar2 = ebuf;
      sVar3 = strlen(ebuf);
      sprintf(pcVar2 + sVar3,"/>\n");
      sVar3 = strlen(ebuf);
      j = (int)sVar3;
      ebuf = (char *)realloc(ebuf,(long)(j + 1));
      if (ebuf == (char *)0x0) {
        fprintf(_stderr,"** NITA: failed to realloc %d bytes\n",(ulong)(j + 1));
      }
      nim_local = (nifti_image *)ebuf;
    }
  }
  return (char *)nim_local;
}

Assistant:

char *nifti_image_to_ascii( const nifti_image *nim )
{
   char *buf , *ebuf ; int nbuf ;

   if( nim == NULL ) return NULL ;   /* stupid caller */

   buf = (char *)calloc(1,65534); nbuf = 0; /* longer than needed, to be safe */
   if( !buf ){
      fprintf(stderr,"** NITA: failed to alloc %d bytes\n",65534);
      return NULL;
   }

   sprintf( buf , "<nifti_image\n" ) ;   /* XML-ish opener */

   sprintf( buf+strlen(buf) , "  nifti_type = '%s'\n" ,
              (nim->nifti_type == NIFTI_FTYPE_NIFTI1_1) ? "NIFTI-1+"
             :(nim->nifti_type == NIFTI_FTYPE_NIFTI1_2) ? "NIFTI-1"
             :(nim->nifti_type == NIFTI_FTYPE_ASCII   ) ? "NIFTI-1A"
             :                         "ANALYZE-7.5" ) ;

   /** Strings that we don't control (filenames, etc.) that might
       contain "weird" characters (like quotes) are "escaped":
       - A few special characters are replaced by XML-style escapes, using
         the function escapize_string().
       - On input, function unescape_string() reverses this process.
       - The result is that the NIFTI ASCII-format header is XML-compliant. */

   ebuf = escapize_string(nim->fname) ;
   sprintf( buf+strlen(buf) , "  header_filename = %s\n",ebuf); free(ebuf);

   ebuf = escapize_string(nim->iname) ;
   sprintf( buf+strlen(buf) , "  image_filename = %s\n", ebuf); free(ebuf);

   sprintf( buf+strlen(buf) , "  image_offset = '%d'\n" , nim->iname_offset );

                       sprintf( buf+strlen(buf), "  ndim = '%d'\n", nim->ndim);
                       sprintf( buf+strlen(buf), "  nx = '%d'\n",   nim->nx  );
   if( nim->ndim > 1 ) sprintf( buf+strlen(buf), "  ny = '%d'\n",   nim->ny  );
   if( nim->ndim > 2 ) sprintf( buf+strlen(buf), "  nz = '%d'\n",   nim->nz  );
   if( nim->ndim > 3 ) sprintf( buf+strlen(buf), "  nt = '%d'\n",   nim->nt  );
   if( nim->ndim > 4 ) sprintf( buf+strlen(buf), "  nu = '%d'\n",   nim->nu  );
   if( nim->ndim > 5 ) sprintf( buf+strlen(buf), "  nv = '%d'\n",   nim->nv  );
   if( nim->ndim > 6 ) sprintf( buf+strlen(buf), "  nw = '%d'\n",   nim->nw  );
                       sprintf( buf+strlen(buf), "  dx = '%g'\n",   nim->dx  );
   if( nim->ndim > 1 ) sprintf( buf+strlen(buf), "  dy = '%g'\n",   nim->dy  );
   if( nim->ndim > 2 ) sprintf( buf+strlen(buf), "  dz = '%g'\n",   nim->dz  );
   if( nim->ndim > 3 ) sprintf( buf+strlen(buf), "  dt = '%g'\n",   nim->dt  );
   if( nim->ndim > 4 ) sprintf( buf+strlen(buf), "  du = '%g'\n",   nim->du  );
   if( nim->ndim > 5 ) sprintf( buf+strlen(buf), "  dv = '%g'\n",   nim->dv  );
   if( nim->ndim > 6 ) sprintf( buf+strlen(buf), "  dw = '%g'\n",   nim->dw  );

   sprintf( buf+strlen(buf) , "  datatype = '%d'\n" , nim->datatype ) ;
   sprintf( buf+strlen(buf) , "  datatype_name = '%s'\n" ,
                              nifti_datatype_string(nim->datatype) ) ;

   sprintf( buf+strlen(buf) , "  nvox = '%u'\n" , (unsigned)nim->nvox ) ;
   sprintf( buf+strlen(buf) , "  nbyper = '%d'\n" , nim->nbyper ) ;

   sprintf( buf+strlen(buf) , "  byteorder = '%s'\n" ,
            (nim->byteorder==MSB_FIRST) ? "MSB_FIRST" : "LSB_FIRST" ) ;

   if( nim->cal_min < nim->cal_max ){
     sprintf( buf+strlen(buf) , "  cal_min = '%g'\n", nim->cal_min ) ;
     sprintf( buf+strlen(buf) , "  cal_max = '%g'\n", nim->cal_max ) ;
   }

   if( nim->scl_slope != 0.0 ){
     sprintf( buf+strlen(buf) , "  scl_slope = '%g'\n" , nim->scl_slope ) ;
     sprintf( buf+strlen(buf) , "  scl_inter = '%g'\n" , nim->scl_inter ) ;
   }

   if( nim->intent_code > 0 ){
     sprintf( buf+strlen(buf) , "  intent_code = '%d'\n", nim->intent_code ) ;
     sprintf( buf+strlen(buf) , "  intent_code_name = '%s'\n" ,
                                nifti_intent_string(nim->intent_code) ) ;
     sprintf( buf+strlen(buf) , "  intent_p1 = '%g'\n" , nim->intent_p1 ) ;
     sprintf( buf+strlen(buf) , "  intent_p2 = '%g'\n" , nim->intent_p2 ) ;
     sprintf( buf+strlen(buf) , "  intent_p3 = '%g'\n" , nim->intent_p3 ) ;

     if( nim->intent_name[0] != '\0' ){
       ebuf = escapize_string(nim->intent_name) ;
       sprintf( buf+strlen(buf) , "  intent_name = %s\n",ebuf) ;
       free(ebuf) ;
     }
   }

   if( nim->toffset != 0.0 )
     sprintf( buf+strlen(buf) , "  toffset = '%g'\n",nim->toffset ) ;

   if( nim->xyz_units > 0 )
     sprintf( buf+strlen(buf) ,
              "  xyz_units = '%d'\n"
              "  xyz_units_name = '%s'\n" ,
              nim->xyz_units , nifti_units_string(nim->xyz_units) ) ;

   if( nim->time_units > 0 )
     sprintf( buf+strlen(buf) ,
              "  time_units = '%d'\n"
              "  time_units_name = '%s'\n" ,
              nim->time_units , nifti_units_string(nim->time_units) ) ;

   if( nim->freq_dim > 0 )
     sprintf( buf+strlen(buf) , "  freq_dim = '%d'\n",nim->freq_dim ) ;
   if( nim->phase_dim > 0 )
     sprintf( buf+strlen(buf) , "  phase_dim = '%d'\n",nim->phase_dim ) ;
   if( nim->slice_dim > 0 )
     sprintf( buf+strlen(buf) , "  slice_dim = '%d'\n",nim->slice_dim ) ;
   if( nim->slice_code > 0 )
     sprintf( buf+strlen(buf) ,
              "  slice_code = '%d'\n"
              "  slice_code_name = '%s'\n" ,
              nim->slice_code , nifti_slice_string(nim->slice_code) ) ;
   if( nim->slice_start >= 0 && nim->slice_end > nim->slice_start )
     sprintf( buf+strlen(buf) ,
              "  slice_start = '%d'\n"
              "  slice_end = '%d'\n"  , nim->slice_start , nim->slice_end ) ;
   if( nim->slice_duration != 0.0 )
     sprintf( buf+strlen(buf) , "  slice_duration = '%g'\n",
              nim->slice_duration ) ;

   if( nim->descrip[0] != '\0' ){
     ebuf = escapize_string(nim->descrip) ;
     sprintf( buf+strlen(buf) , "  descrip = %s\n",ebuf) ;
     free(ebuf) ;
   }

   if( nim->aux_file[0] != '\0' ){
     ebuf = escapize_string(nim->aux_file) ;
     sprintf( buf+strlen(buf) , "  aux_file = %s\n",ebuf) ;
     free(ebuf) ;
   }

   if( nim->qform_code > 0 ){
     int i,j,k ;

     sprintf( buf+strlen(buf) ,
              "  qform_code = '%d'\n"
              "  qform_code_name = '%s'\n"
     "  qto_xyz_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->qform_code      , nifti_xform_string(nim->qform_code) ,
         nim->qto_xyz.m[0][0] , nim->qto_xyz.m[0][1] ,
         nim->qto_xyz.m[0][2] , nim->qto_xyz.m[0][3] ,
         nim->qto_xyz.m[1][0] , nim->qto_xyz.m[1][1] ,
         nim->qto_xyz.m[1][2] , nim->qto_xyz.m[1][3] ,
         nim->qto_xyz.m[2][0] , nim->qto_xyz.m[2][1] ,
         nim->qto_xyz.m[2][2] , nim->qto_xyz.m[2][3] ,
         nim->qto_xyz.m[3][0] , nim->qto_xyz.m[3][1] ,
         nim->qto_xyz.m[3][2] , nim->qto_xyz.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
     "  qto_ijk_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->qto_ijk.m[0][0] , nim->qto_ijk.m[0][1] ,
         nim->qto_ijk.m[0][2] , nim->qto_ijk.m[0][3] ,
         nim->qto_ijk.m[1][0] , nim->qto_ijk.m[1][1] ,
         nim->qto_ijk.m[1][2] , nim->qto_ijk.m[1][3] ,
         nim->qto_ijk.m[2][0] , nim->qto_ijk.m[2][1] ,
         nim->qto_ijk.m[2][2] , nim->qto_ijk.m[2][3] ,
         nim->qto_ijk.m[3][0] , nim->qto_ijk.m[3][1] ,
         nim->qto_ijk.m[3][2] , nim->qto_ijk.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
              "  quatern_b = '%g'\n"
              "  quatern_c = '%g'\n"
              "  quatern_d = '%g'\n"
              "  qoffset_x = '%g'\n"
              "  qoffset_y = '%g'\n"
              "  qoffset_z = '%g'\n"
              "  qfac = '%g'\n" ,
         nim->quatern_b , nim->quatern_c , nim->quatern_d ,
         nim->qoffset_x , nim->qoffset_y , nim->qoffset_z , nim->qfac ) ;

     nifti_mat44_to_orientation( nim->qto_xyz , &i,&j,&k ) ;
     if( i > 0 && j > 0 && k > 0 )
       sprintf( buf+strlen(buf) ,
                "  qform_i_orientation = '%s'\n"
                "  qform_j_orientation = '%s'\n"
                "  qform_k_orientation = '%s'\n" ,
                nifti_orientation_string(i) ,
                nifti_orientation_string(j) ,
                nifti_orientation_string(k)  ) ;
   }

   if( nim->sform_code > 0 ){
     int i,j,k ;

     sprintf( buf+strlen(buf) ,
              "  sform_code = '%d'\n"
              "  sform_code_name = '%s'\n"
     "  sto_xyz_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->sform_code      , nifti_xform_string(nim->sform_code) ,
         nim->sto_xyz.m[0][0] , nim->sto_xyz.m[0][1] ,
         nim->sto_xyz.m[0][2] , nim->sto_xyz.m[0][3] ,
         nim->sto_xyz.m[1][0] , nim->sto_xyz.m[1][1] ,
         nim->sto_xyz.m[1][2] , nim->sto_xyz.m[1][3] ,
         nim->sto_xyz.m[2][0] , nim->sto_xyz.m[2][1] ,
         nim->sto_xyz.m[2][2] , nim->sto_xyz.m[2][3] ,
         nim->sto_xyz.m[3][0] , nim->sto_xyz.m[3][1] ,
         nim->sto_xyz.m[3][2] , nim->sto_xyz.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
     "  sto_ijk matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->sto_ijk.m[0][0] , nim->sto_ijk.m[0][1] ,
         nim->sto_ijk.m[0][2] , nim->sto_ijk.m[0][3] ,
         nim->sto_ijk.m[1][0] , nim->sto_ijk.m[1][1] ,
         nim->sto_ijk.m[1][2] , nim->sto_ijk.m[1][3] ,
         nim->sto_ijk.m[2][0] , nim->sto_ijk.m[2][1] ,
         nim->sto_ijk.m[2][2] , nim->sto_ijk.m[2][3] ,
         nim->sto_ijk.m[3][0] , nim->sto_ijk.m[3][1] ,
         nim->sto_ijk.m[3][2] , nim->sto_ijk.m[3][3]  ) ;

     nifti_mat44_to_orientation( nim->sto_xyz , &i,&j,&k ) ;
     if( i > 0 && j > 0 && k > 0 )
       sprintf( buf+strlen(buf) ,
                "  sform_i_orientation = '%s'\n"
                "  sform_j_orientation = '%s'\n"
                "  sform_k_orientation = '%s'\n" ,
                nifti_orientation_string(i) ,
                nifti_orientation_string(j) ,
                nifti_orientation_string(k)  ) ;
   }

   sprintf( buf+strlen(buf) , "  num_ext = '%d'\n", nim->num_ext ) ;

   sprintf( buf+strlen(buf) , "/>\n" ) ;   /* XML-ish closer */

   nbuf = (int)strlen(buf) ;
   buf  = (char *)realloc((void *)buf, nbuf+1); /* cut back to proper length */
   if( !buf ) fprintf(stderr,"** NITA: failed to realloc %d bytes\n",nbuf+1);
   return buf ;
}